

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void __thiscall
sisl::array_n<char,_3,_std::allocator<char>_>::_alloc
          (array_n<char,_3,_std::allocator<char>_> *this,uint n)

{
  char *pcVar1;
  char local_21;
  ulong local_20;
  size_type i;
  array_n<char,_3,_std::allocator<char>_> *paStack_10;
  uint n_local;
  array_n<char,_3,_std::allocator<char>_> *this_local;
  
  if (n == 0) {
    this->_array = (char *)0x0;
  }
  else {
    i._4_4_ = n;
    paStack_10 = this;
    pcVar1 = __gnu_cxx::new_allocator<char>::allocate
                       ((new_allocator<char> *)this,(ulong)n,(void *)0x0);
    this->first = pcVar1;
    for (local_20 = 0; local_20 < i._4_4_; local_20 = local_20 + 1) {
      local_21 = '\0';
      __gnu_cxx::new_allocator<char>::construct<char,char>
                ((new_allocator<char> *)this,this->first + local_20,&local_21);
    }
    this->last = this->first + local_20;
    this->_array = this->first;
  }
  return;
}

Assistant:

void _alloc(unsigned int n) {
            size_type i;
            if(n == 0) {
                this->_array = nullptr;
                return;
            }

            this->first = Allocator::allocate(n);
            try {
                for (i = 0; i < n; ++i) {
                    Allocator::construct(first + i, T());
                }
            }catch(...) {
                for(size_type j = 0; j < i; ++j) {
                     Allocator::destroy(first + j);
                }
                Allocator::deallocate(first, n);
                throw;
            }
            last = first + i;
            this->_array = static_cast<T *>(first);
        }